

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
protozero::CopyablePtr<perfetto::protos::gen::ChromeWindowHandleEventInfo>::CopyablePtr
          (CopyablePtr<perfetto::protos::gen::ChromeWindowHandleEventInfo> *this,
          CopyablePtr<perfetto::protos::gen::ChromeWindowHandleEventInfo> *other)

{
  ChromeWindowHandleEventInfo *this_00;
  CopyablePtr<perfetto::protos::gen::ChromeWindowHandleEventInfo> *other_local;
  CopyablePtr<perfetto::protos::gen::ChromeWindowHandleEventInfo> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::ChromeWindowHandleEventInfo,_std::default_delete<perfetto::protos::gen::ChromeWindowHandleEventInfo>_>
  ::unique_ptr(&this->ptr_,&other->ptr_);
  this_00 = (ChromeWindowHandleEventInfo *)operator_new(0x40);
  perfetto::protos::gen::ChromeWindowHandleEventInfo::ChromeWindowHandleEventInfo(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::ChromeWindowHandleEventInfo,_std::default_delete<perfetto::protos::gen::ChromeWindowHandleEventInfo>_>
  ::reset(&other->ptr_,this_00);
  return;
}

Assistant:

CopyablePtr(CopyablePtr&& other) noexcept : ptr_(std::move(other.ptr_)) {
    other.ptr_.reset(new T());
  }